

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Font.cpp
# Opt level: O1

Page * __thiscall sf::Font::loadPage(Font *this,uint characterSize)

{
  _Rb_tree_header *p_Var1;
  _Base_ptr p_Var2;
  _Rb_tree_iterator<std::pair<const_unsigned_int,_sf::Font::Page>_> _Var3;
  _Base_ptr p_Var4;
  bool bVar5;
  pair<std::_Rb_tree_iterator<std::pair<const_unsigned_int,_sf::Font::Page>_>,_bool> pVar6;
  uint local_10c;
  pair<unsigned_int,_sf::Font::Page> local_108;
  Page local_88;
  
  p_Var1 = &(this->m_pages)._M_t._M_impl.super__Rb_tree_header;
  p_Var2 = (this->m_pages)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  p_Var4 = &p_Var1->_M_header;
  for (; p_Var2 != (_Base_ptr)0x0; p_Var2 = (&p_Var2->_M_left)[bVar5]) {
    bVar5 = p_Var2[1]._M_color < characterSize;
    if (!bVar5) {
      p_Var4 = p_Var2;
    }
  }
  _Var3._M_node = &p_Var1->_M_header;
  if (((_Rb_tree_header *)p_Var4 != p_Var1) &&
     (_Var3._M_node = p_Var4, characterSize < p_Var4[1]._M_color)) {
    _Var3._M_node = &p_Var1->_M_header;
  }
  if ((_Rb_tree_header *)_Var3._M_node == p_Var1) {
    local_10c = characterSize;
    Page::Page(&local_88,this->m_isSmooth);
    std::pair<unsigned_int,_sf::Font::Page>::pair<unsigned_int_&,_sf::Font::Page,_true>
              (&local_108,&local_10c,&local_88);
    pVar6 = std::
            _Rb_tree<unsigned_int,std::pair<unsigned_int_const,sf::Font::Page>,std::_Select1st<std::pair<unsigned_int_const,sf::Font::Page>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,sf::Font::Page>>>
            ::_M_emplace_unique<std::pair<unsigned_int,sf::Font::Page>>
                      ((_Rb_tree<unsigned_int,std::pair<unsigned_int_const,sf::Font::Page>,std::_Select1st<std::pair<unsigned_int_const,sf::Font::Page>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,sf::Font::Page>>>
                        *)&this->m_pages,&local_108);
    _Var3 = pVar6.first._M_node;
    if (local_108.second.rows.super__Vector_base<sf::Font::Row,_std::allocator<sf::Font::Row>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_108.second.rows.
                      super__Vector_base<sf::Font::Row,_std::allocator<sf::Font::Row>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    Texture::~Texture(&local_108.second.texture);
    std::
    _Rb_tree<unsigned_long_long,_std::pair<const_unsigned_long_long,_sf::Glyph>,_std::_Select1st<std::pair<const_unsigned_long_long,_sf::Glyph>_>,_std::less<unsigned_long_long>,_std::allocator<std::pair<const_unsigned_long_long,_sf::Glyph>_>_>
    ::~_Rb_tree((_Rb_tree<unsigned_long_long,_std::pair<const_unsigned_long_long,_sf::Glyph>,_std::_Select1st<std::pair<const_unsigned_long_long,_sf::Glyph>_>,_std::less<unsigned_long_long>,_std::allocator<std::pair<const_unsigned_long_long,_sf::Glyph>_>_>
                 *)&local_108.second);
    if (local_88.rows.super__Vector_base<sf::Font::Row,_std::allocator<sf::Font::Row>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_88.rows.
                      super__Vector_base<sf::Font::Row,_std::allocator<sf::Font::Row>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    Texture::~Texture(&local_88.texture);
    std::
    _Rb_tree<unsigned_long_long,_std::pair<const_unsigned_long_long,_sf::Glyph>,_std::_Select1st<std::pair<const_unsigned_long_long,_sf::Glyph>_>,_std::less<unsigned_long_long>,_std::allocator<std::pair<const_unsigned_long_long,_sf::Glyph>_>_>
    ::~_Rb_tree((_Rb_tree<unsigned_long_long,_std::pair<const_unsigned_long_long,_sf::Glyph>,_std::_Select1st<std::pair<const_unsigned_long_long,_sf::Glyph>_>,_std::less<unsigned_long_long>,_std::allocator<std::pair<const_unsigned_long_long,_sf::Glyph>_>_>
                 *)&local_88);
  }
  return (Page *)&_Var3._M_node[1]._M_parent;
}

Assistant:

Font::Page& Font::loadPage(unsigned int characterSize) const
{
    // TODO: Remove this method and use try_emplace instead when updating to C++17
    PageTable::iterator pageIterator = m_pages.find(characterSize);
    if (pageIterator == m_pages.end())
        pageIterator = m_pages.insert(std::make_pair(characterSize, Page(m_isSmooth))).first;

    return pageIterator->second;
}